

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_listener.cpp
# Opt level: O2

void __thiscall
chatter::PacketLoggerCSV::on_send
          (PacketLoggerCSV *this,uint64_t ts,PacketStats *packet_stats,PeerStats *peer_stats)

{
  char cVar1;
  ostream *poVar2;
  char *this_00;
  string local_40;
  
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&this->m_file);
    this_00 = " SEND>>>  ";
    poVar2 = std::operator<<(poVar2," SEND>>>  ");
    PacketListener::debug_string_abi_cxx11_
              (&local_40,(PacketListener *)this_00,packet_stats,peer_stats);
    poVar2 = std::operator<<(poVar2,(string *)&local_40);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void PacketLoggerCSV::on_send(uint64_t ts, const PacketStats& packet_stats, const PeerStats& peer_stats)
{
    if (!m_file.is_open())
        return;
    m_file << ts << " SEND>>>  " << debug_string(packet_stats, peer_stats) << std::endl;
}